

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O0

bool DoSearch<DNA>(string *queryPath,string *databasePath,string *outputPath,
                  SearchParams<DNA> *searchParams)

{
  bool bVar1;
  pointer pSVar2;
  type pSVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 local_6c0 [8];
  SequenceList<DNA> queries;
  unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_> qryReader;
  OnProcessedCallback local_660;
  anon_class_8_1_ac40e7ab local_640;
  OnProcessedCallback local_638;
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  local_618 [8];
  QueryDatabaseSearcher<DNA> searcher;
  SearchResultsWriter<DNA> writer;
  anon_class_8_1_ac40e7ab aStack_350;
  int numQueriesPerWorkItem;
  OnProgressCallback local_348;
  undefined1 local_328 [8];
  Database<DNA> db;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_> dbReader;
  SequenceList<DNA> sequences;
  undefined1 local_c0 [8];
  Sequence<DNA> seq;
  ProgressOutput progress;
  SearchParams<DNA> *searchParams_local;
  string *outputPath_local;
  string *databasePath_local;
  string *queryPath_local;
  
  ProgressOutput::ProgressOutput((ProgressOutput *)((long)&seq.sequence.field_2 + 8));
  Sequence<DNA>::Sequence((Sequence<DNA> *)local_c0);
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::deque
            ((deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)&dbReader);
  DetectFileFormatAndOpenReader<DNA>((string *)local_128,(FileFormat)databasePath);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"Read database",&local_149);
  ProgressOutput::Add((ProgressOutput *)((long)&seq.sequence.field_2 + 8),0,&local_148,BYTES);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"Analyze database",&local_171);
  ProgressOutput::Add((ProgressOutput *)((long)&seq.sequence.field_2 + 8),1,&local_170,COUNTS);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"Index database",&local_199);
  ProgressOutput::Add((ProgressOutput *)((long)&seq.sequence.field_2 + 8),2,&local_198,COUNTS);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"Read queries",&local_1c1);
  ProgressOutput::Add((ProgressOutput *)((long)&seq.sequence.field_2 + 8),3,&local_1c0,BYTES);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"Search database",&local_1e9);
  ProgressOutput::Add((ProgressOutput *)((long)&seq.sequence.field_2 + 8),4,&local_1e8,COUNTS);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"Write hits",
             (allocator *)((long)&db.mProgressCallback._M_invoker + 7));
  ProgressOutput::Add((ProgressOutput *)((long)&seq.sequence.field_2 + 8),5,&local_210,COUNTS);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)((long)&db.mProgressCallback._M_invoker + 7));
  ProgressOutput::Activate((ProgressOutput *)((long)&seq.sequence.field_2 + 8),0);
  while( true ) {
    pSVar2 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator->((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                         *)local_128);
    bVar1 = SequenceReader<DNA>::EndOfFile(pSVar2);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar3 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator*((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                        *)local_128);
    (**pSVar3->_vptr_SequenceReader)(pSVar3,local_c0);
    std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::push_back
              ((deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)&dbReader,
               (value_type *)local_c0);
    pSVar2 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator->((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                         *)local_128);
    sVar4 = SequenceReader<DNA>::NumBytesRead(pSVar2);
    pSVar2 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator->((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                         *)local_128);
    sVar5 = SequenceReader<DNA>::NumBytesTotal(pSVar2);
    ProgressOutput::Set((ProgressOutput *)((long)&seq.sequence.field_2 + 8),0,sVar4,sVar5);
  }
  Database<DNA>::Database((Database<DNA> *)local_328,8);
  aStack_350.progress = (ProgressOutput *)((long)&seq.sequence.field_2 + 8);
  std::function<void(Database<DNA>::ProgressType,unsigned_long,unsigned_long)>::
  function<DoSearch<DNA>(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,SearchParams<DNA>const&)::_lambda(Database<DNA>::ProgressType,unsigned_long,unsigned_long)_1_,void>
            ((function<void(Database<DNA>::ProgressType,unsigned_long,unsigned_long)> *)&local_348,
             &stack0xfffffffffffffcb0);
  Database<DNA>::SetProgressCallback((Database<DNA> *)local_328,&local_348);
  std::function<void_(Database<DNA>::ProgressType,_unsigned_long,_unsigned_long)>::~function
            (&local_348);
  Database<DNA>::Initialize((Database<DNA> *)local_328,(SequenceList<DNA> *)&dbReader);
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::WorkerQueue((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&searcher.mProcessedCallbacks.
                    super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,1,outputPath);
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  ::WorkerQueue(local_618,-1,
                (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&searcher.mProcessedCallbacks.
                    super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,(Database<DNA> *)local_328,
                searchParams);
  local_640.progress = (ProgressOutput *)((long)&seq.sequence.field_2 + 8);
  std::function<void(unsigned_long,unsigned_long)>::
  function<DoSearch<DNA>(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,SearchParams<DNA>const&)::_lambda(unsigned_long,unsigned_long)_1_,void>
            ((function<void(unsigned_long,unsigned_long)> *)&local_638,&local_640);
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  ::OnProcessed(local_618,&local_638);
  std::function<void_(unsigned_long,_unsigned_long)>::~function(&local_638);
  qryReader._M_t.
  super___uniq_ptr_impl<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>._M_t.
  super__Tuple_impl<0UL,_SequenceReader<DNA>_*,_std::default_delete<SequenceReader<DNA>_>_>.
  super__Head_base<0UL,_SequenceReader<DNA>_*,_false>._M_head_impl =
       (__uniq_ptr_data<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>,_true,_true>)
       ((long)&seq.sequence.field_2 + 8);
  std::function<void(unsigned_long,unsigned_long)>::
  function<DoSearch<DNA>(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,SearchParams<DNA>const&)::_lambda(unsigned_long,unsigned_long)_2_,void>
            ((function<void(unsigned_long,unsigned_long)> *)&local_660,
             (anon_class_8_1_ac40e7ab *)&qryReader);
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::OnProcessed((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)&searcher.mProcessedCallbacks.
                    super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_660);
  std::function<void_(unsigned_long,_unsigned_long)>::~function(&local_660);
  DetectFileFormatAndOpenReader<DNA>
            ((string *)
             &queries.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,(FileFormat)queryPath);
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::deque
            ((deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)local_6c0);
  ProgressOutput::Activate((ProgressOutput *)((long)&seq.sequence.field_2 + 8),3);
  while( true ) {
    pSVar2 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator->((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                         *)&queries.
                            super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node);
    bVar1 = SequenceReader<DNA>::EndOfFile(pSVar2);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar2 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator->((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                         *)&queries.
                            super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node);
    SequenceReader<DNA>::Read(pSVar2,0x40,(SequenceList<DNA> *)local_6c0);
    WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
    ::Enqueue(local_618,(deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)local_6c0);
    pSVar2 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator->((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                         *)&queries.
                            super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node);
    sVar4 = SequenceReader<DNA>::NumBytesRead(pSVar2);
    pSVar2 = std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::
             operator->((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>
                         *)&queries.
                            super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node);
    sVar5 = SequenceReader<DNA>::NumBytesTotal(pSVar2);
    ProgressOutput::Set((ProgressOutput *)((long)&seq.sequence.field_2 + 8),3,sVar4,sVar5);
  }
  ProgressOutput::Activate((ProgressOutput *)((long)&seq.sequence.field_2 + 8),4);
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  ::WaitTillDone(local_618);
  ProgressOutput::Activate((ProgressOutput *)((long)&seq.sequence.field_2 + 8),5);
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::WaitTillDone((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&searcher.mProcessedCallbacks.
                     super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::~deque
            ((deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)local_6c0);
  std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::~unique_ptr
            ((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_> *)
             &queries.super__Deque_base<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  ::~WorkerQueue(local_618);
  WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~WorkerQueue((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&searcher.mProcessedCallbacks.
                     super__Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
  Database<DNA>::~Database((Database<DNA> *)local_328);
  std::unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_>::~unique_ptr
            ((unique_ptr<SequenceReader<DNA>,_std::default_delete<SequenceReader<DNA>_>_> *)
             local_128);
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::~deque
            ((deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)&dbReader);
  Sequence<DNA>::~Sequence((Sequence<DNA> *)local_c0);
  ProgressOutput::~ProgressOutput((ProgressOutput *)((long)&seq.sequence.field_2 + 8));
  return true;
}

Assistant:

bool DoSearch( const std::string& queryPath, const std::string& databasePath,
               const std::string&       outputPath,
               const SearchParams< A >& searchParams ) {
  ProgressOutput progress;

  Sequence< A >     seq;
  SequenceList< A > sequences;

  auto dbReader = DetectFileFormatAndOpenReader< A >( databasePath, FileFormat::FASTA );

  enum ProgressType {
    ReadDBFile,
    StatsDB,
    IndexDB,
    ReadQueryFile,
    SearchDB,
    WriteHits
  };

  progress.Add( ProgressType::ReadDBFile, "Read database", UnitType::BYTES );
  progress.Add( ProgressType::StatsDB, "Analyze database" );
  progress.Add( ProgressType::IndexDB, "Index database" );
  progress.Add( ProgressType::ReadQueryFile, "Read queries", UnitType::BYTES );
  progress.Add( ProgressType::SearchDB, "Search database" );
  progress.Add( ProgressType::WriteHits, "Write hits" );

  // Read DB
  progress.Activate( ProgressType::ReadDBFile );
  while( !dbReader->EndOfFile() ) {
    (*dbReader) >> seq;
    sequences.push_back( std::move( seq ) );
    progress.Set( ProgressType::ReadDBFile, dbReader->NumBytesRead(),
                  dbReader->NumBytesTotal() );
  }

  // Index DB
  Database< A > db( WordSize< A >::VALUE );
  db.SetProgressCallback(
    [&]( typename Database< A >::ProgressType type, size_t num, size_t total ) {
      switch( type ) {
        case Database< A >::ProgressType::StatsCollection:
          progress.Activate( ProgressType::StatsDB )
            .Set( ProgressType::StatsDB, num, total );
          break;

        case Database< A >::ProgressType::Indexing:
          progress.Activate( ProgressType::IndexDB )
            .Set( ProgressType::IndexDB, num, total );
          break;

        default:
          break;
      }
    } );
  db.Initialize( sequences );

  // Read and process queries
  const int numQueriesPerWorkItem = 64;

  SearchResultsWriter< A >   writer( 1, outputPath );
  QueryDatabaseSearcher< A > searcher( -1, &writer, &db, searchParams );

  searcher.OnProcessed( [&]( size_t numProcessed, size_t numEnqueued ) {
    progress.Set( ProgressType::SearchDB, numProcessed, numEnqueued );
  } );
  writer.OnProcessed( [&]( size_t numProcessed, size_t numEnqueued ) {
    progress.Set( ProgressType::WriteHits, numProcessed, numEnqueued );
  } );

  auto qryReader = DetectFileFormatAndOpenReader< A >( queryPath, FileFormat::FASTA );

  SequenceList< A > queries;
  progress.Activate( ProgressType::ReadQueryFile );
  while( !qryReader->EndOfFile() ) {
    qryReader->Read( numQueriesPerWorkItem, &queries );
    searcher.Enqueue( queries );
    progress.Set( ProgressType::ReadQueryFile, qryReader->NumBytesRead(),
                  qryReader->NumBytesTotal() );
  }

  // Search
  progress.Activate( ProgressType::SearchDB );
  searcher.WaitTillDone();

  progress.Activate( ProgressType::WriteHits );
  writer.WaitTillDone();

  return true;
}